

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::StringPtr&,char>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char *params_1)

{
  undefined1 local_19 [9];
  FixedArray<char,_1UL> *local_10;
  
  local_19._1_8_ = *(undefined8 *)this;
  local_10 = (FixedArray<char,_1UL> *)(*(long *)(this + 8) + -1);
  local_19[0] = *(undefined1 *)&(params->content).ptr;
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)(local_19 + 1),(ArrayPtr<const_char> *)local_19,local_10);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}